

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<float>::Decompose_Cholesky
          (TPZMatrix<float> *this,list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  list<long,_std::allocator<long>_> *plVar2;
  char cVar3;
  int iVar4;
  int extraout_var;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float __x;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  float extraout_XMM0_Da_07;
  float extraout_XMM0_Da_08;
  float extraout_XMM0_Da_09;
  float tmp;
  float local_4c;
  float local_48;
  float local_44;
  _List_node_base *local_40;
  list<long,_std::allocator<long>_> *local_38;
  _List_node_base *p_Var5;
  
  cVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  local_38 = singular;
  if ((cVar3 != '\0') && (cVar3 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar3 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    p_Var5 = (_List_node_base *)CONCAT44(extraout_var,iVar4);
    if (p_Var5 != (_List_node_base *)0x0 && -1 < extraout_var) {
      p_Var7 = (_List_node_base *)0x0;
      do {
        if (p_Var7 != (_List_node_base *)0x0) {
          p_Var6 = (_List_node_base *)0x0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,p_Var7,p_Var7);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,p_Var7,p_Var6);
            local_48 = extraout_XMM0_Da_00;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,p_Var7,p_Var6);
            local_4c = extraout_XMM0_Da - extraout_XMM0_Da_01 * local_48;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,p_Var7,p_Var7,&local_4c);
            p_Var6 = (_List_node_base *)((long)&p_Var6->_M_next + 1);
          } while (p_Var7 != p_Var6);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,p_Var7,p_Var7);
        if (ABS(extraout_XMM0_Da_02) <= 1e-12) {
          p_Var6 = (_List_node_base *)operator_new(0x18);
          plVar2 = local_38;
          p_Var6[1]._M_next = p_Var7;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar1 = &(plVar2->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          local_4c = 1.0;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,p_Var7,p_Var7,&local_4c);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,p_Var7,p_Var7);
        if (__x < 0.0) {
          local_4c = sqrtf(__x);
        }
        else {
          local_4c = SQRT(__x);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,p_Var7,p_Var7,&local_4c);
        p_Var6 = (_List_node_base *)((long)&p_Var7->_M_next + 1);
        local_40 = p_Var6;
        for (; (long)p_Var6 < (long)p_Var5; p_Var6 = (_List_node_base *)((long)&p_Var6->_M_next + 1)
            ) {
          if (p_Var7 != (_List_node_base *)0x0) {
            p_Var8 = (_List_node_base *)0x0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,p_Var7,p_Var6);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,p_Var7,p_Var8);
              local_48 = extraout_XMM0_Da_04;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,p_Var8,p_Var6);
              local_44 = extraout_XMM0_Da_03 - extraout_XMM0_Da_05 * local_48;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (this,p_Var7,p_Var6,&local_44);
              p_Var8 = (_List_node_base *)((long)&p_Var8->_M_next + 1);
            } while (p_Var7 != p_Var8);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,p_Var7,p_Var7)
          ;
          if (ABS(extraout_XMM0_Da_06) < 1e-06) {
            Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,p_Var7,p_Var6)
          ;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,p_Var7,p_Var7)
          ;
          local_44 = extraout_XMM0_Da_07 / extraout_XMM0_Da_08;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,p_Var7,p_Var6,&local_44);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,p_Var7,p_Var6)
          ;
          local_44 = extraout_XMM0_Da_09;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,p_Var6,p_Var7,&local_44);
        }
        p_Var7 = local_40;
      } while (local_40 != p_Var5);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}